

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O3

int h2o_cache_set(h2o_cache_t *cache,uint64_t now,h2o_iovec_t key,h2o_cache_hashcode_t keyhash,
                 h2o_iovec_t value)

{
  h2o_linklist_t *phVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  kh_cache_t *h;
  khint32_t *pkVar5;
  size_t sVar6;
  st_h2o_linklist_t *psVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  size_t sVar11;
  h2o_cache_ref_t *phVar12;
  byte bVar13;
  sbyte sVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  khint_t new_n_buckets;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  h2o_iovec_t hVar22;
  
  if (keyhash == 0) {
    keyhash = 0;
    for (sVar11 = key.len; sVar11 != 0; sVar11 = sVar11 - 1) {
      keyhash = (uint)(byte)key.base[sVar11 - 1] + keyhash * 0x1f;
    }
  }
  phVar12 = (h2o_cache_ref_t *)malloc(0x60);
  if (phVar12 == (h2o_cache_ref_t *)0x0) {
    h2o__fatal(
              "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
              );
  }
  hVar22 = h2o_strdup((h2o_mem_pool_t *)0x0,key.base,key.len);
  (phVar12->value).base = value.base;
  (phVar12->value).len = value.len;
  phVar12->key = hVar22;
  phVar12->keyhash = keyhash;
  phVar12->at = now;
  phVar12->_requested_early_update = 0;
  (phVar12->_lru_link).next = (st_h2o_linklist_t *)0x0;
  (phVar12->_lru_link).prev = (st_h2o_linklist_t *)0x0;
  (phVar12->_age_link).next = (st_h2o_linklist_t *)0x0;
  (phVar12->_age_link).prev = (st_h2o_linklist_t *)0x0;
  phVar12->_refcnt = 1;
  if ((cache->flags & 1) != 0) {
    pthread_mutex_lock((pthread_mutex_t *)&cache->mutex);
  }
  phVar1 = &phVar12->_lru_link;
  h = cache->table;
  uVar4 = h->n_buckets;
  uVar18 = 0;
  if (uVar4 == 0) {
LAB_00127cbf:
    if (uVar18 != uVar4) {
      iVar20 = 1;
      erase_ref(cache,uVar18,1);
      cache->table->keys[uVar18] = phVar12;
      goto LAB_00127e97;
    }
  }
  else {
    uVar16 = phVar12->keyhash & uVar4 - 1;
    pkVar5 = h->flags;
    iVar20 = 1;
    uVar18 = uVar16;
    do {
      uVar15 = pkVar5[uVar18 >> 4];
      bVar13 = (char)uVar18 * '\x02' & 0x1e;
      uVar9 = uVar15 >> bVar13;
      if ((uVar9 & 2) != 0) {
LAB_00127cae:
        if ((uVar15 >> bVar13 & 3) != 0) {
          uVar18 = uVar4;
        }
        goto LAB_00127cbf;
      }
      if ((uVar9 & 1) == 0) {
        sVar6 = (h->keys[uVar18]->key).len;
        if ((sVar6 == (phVar12->key).len) &&
           (iVar10 = bcmp((h->keys[uVar18]->key).base,(phVar12->key).base,sVar6), iVar10 == 0))
        goto LAB_00127cae;
      }
      uVar18 = uVar18 + iVar20 & uVar4 - 1;
      iVar20 = iVar20 + 1;
    } while (uVar18 != uVar16);
  }
  if (h->upper_bound <= h->n_occupied) {
    if (h->size * 2 < uVar4) {
      new_n_buckets = uVar4 - 1;
    }
    else {
      new_n_buckets = uVar4 + 1;
    }
    iVar20 = kh_resize_cache(h,new_n_buckets);
    if (iVar20 < 0) {
      iVar20 = 0;
      goto LAB_00127e97;
    }
  }
  uVar4 = h->n_buckets;
  uVar19 = (ulong)uVar4;
  uVar18 = phVar12->keyhash & uVar4 - 1;
  pkVar5 = h->flags;
  if ((pkVar5[uVar18 >> 4] >> ((char)uVar18 * '\x02' & 0x1fU) & 2) == 0) {
    iVar20 = 1;
    uVar16 = uVar18;
    do {
      uVar15 = pkVar5[uVar16 >> 4];
      uVar17 = uVar16 * 2 & 0x1e;
      sVar14 = (sbyte)uVar17;
      uVar9 = uVar15 >> sVar14;
      if ((uVar9 & 2) != 0) {
LAB_00127dfb:
        bVar21 = (uVar15 >> sVar14 & 2) == 0;
        uVar15 = (uint)uVar19;
        goto LAB_00127e12;
      }
      if ((uVar9 & 1) == 0) {
        sVar6 = (h->keys[uVar16]->key).len;
        if ((sVar6 == (phVar12->key).len) &&
           (iVar10 = bcmp((h->keys[uVar16]->key).base,(phVar12->key).base,sVar6), iVar10 == 0))
        goto LAB_00127dfb;
      }
      if ((uVar15 >> uVar17 & 1) != 0) {
        uVar19 = (ulong)uVar16;
      }
      uVar16 = uVar16 + iVar20 & uVar4 - 1;
      iVar20 = iVar20 + 1;
    } while (uVar16 != uVar18);
    bVar21 = true;
    uVar15 = uVar4;
    uVar16 = uVar18;
    if ((uint)uVar19 == uVar4) {
LAB_00127e12:
      if (uVar15 == uVar4) {
        uVar15 = uVar16;
      }
      if (bVar21) {
        uVar15 = uVar16;
      }
      uVar19 = (ulong)uVar15;
    }
  }
  else {
    uVar19 = (ulong)uVar18;
  }
  uVar8 = uVar19 >> 4;
  bVar13 = (char)uVar19 * '\x02' & 0x1e;
  if ((pkVar5[uVar8] >> bVar13 & 2) == 0) {
    iVar20 = 0;
    if ((pkVar5[uVar8] >> bVar13 & 1) != 0) {
      h->keys[uVar19] = phVar12;
      h->flags[uVar8] = h->flags[uVar8] & ~(3 << bVar13);
      h->size = h->size + 1;
      iVar20 = 0;
    }
  }
  else {
    h->keys[uVar19] = phVar12;
    h->flags[uVar8] = h->flags[uVar8] & ~(3 << bVar13);
    uVar2 = h->size;
    uVar3 = h->n_occupied;
    h->size = uVar2 + 1;
    h->n_occupied = uVar3 + 1;
    iVar20 = 0;
  }
LAB_00127e97:
  if (phVar1->next == (st_h2o_linklist_t *)0x0) {
    psVar7 = (cache->lru).prev;
    (phVar12->_lru_link).prev = psVar7;
    (phVar12->_lru_link).next = &cache->lru;
    psVar7->next = phVar1;
    ((phVar12->_lru_link).next)->prev = phVar1;
    if ((phVar12->_age_link).next == (st_h2o_linklist_t *)0x0) {
      psVar7 = (cache->age).prev;
      (phVar12->_age_link).prev = psVar7;
      (phVar12->_age_link).next = &cache->age;
      psVar7->next = &phVar12->_age_link;
      ((phVar12->_age_link).next)->prev = &phVar12->_age_link;
      cache->size = cache->size + (phVar12->value).len;
      purge(cache,now);
      if ((cache->flags & 1) != 0) {
        pthread_mutex_unlock((pthread_mutex_t *)&cache->mutex);
      }
      return iVar20;
    }
  }
  __assert_fail("!h2o_linklist_is_linked(node)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/linklist.h"
                ,0x59,"void h2o_linklist_insert(h2o_linklist_t *, h2o_linklist_t *)");
}

Assistant:

int h2o_cache_set(h2o_cache_t *cache, uint64_t now, h2o_iovec_t key, h2o_cache_hashcode_t keyhash, h2o_iovec_t value)
{
    h2o_cache_ref_t *newref;
    khiter_t iter;
    int existed;

    if (keyhash == 0)
        keyhash = h2o_cache_calchash(key.base, key.len);

    /* create newref */
    newref = h2o_mem_alloc(sizeof(*newref));
    *newref = (h2o_cache_ref_t){h2o_strdup(NULL, key.base, key.len), keyhash, now, value, 0, {NULL}, {NULL}, 1};

    lock_cache(cache);

    /* set or replace the named value */
    iter = kh_get(cache, cache->table, newref);
    if (iter != kh_end(cache->table)) {
        erase_ref(cache, iter, 1);
        kh_key(cache->table, iter) = newref;
        existed = 1;
    } else {
        int unused;
        kh_put(cache, cache->table, newref, &unused);
        existed = 0;
    }
    h2o_linklist_insert(&cache->lru, &newref->_lru_link);
    h2o_linklist_insert(&cache->age, &newref->_age_link);
    cache->size += newref->value.len;

    purge(cache, now);

    unlock_cache(cache);

    return existed;
}